

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace_printer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::NamespacePrinterTest_Basic_Test::
~NamespacePrinterTest_Basic_Test(NamespacePrinterTest_Basic_Test *this)

{
  NamespacePrinterTest::~NamespacePrinterTest(&this->super_NamespacePrinterTest);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(NamespacePrinterTest, Basic) {
  {
    io::Printer printer(output(), '$');

    const NamespacePrinter namespace_printer(&printer, {"A", "B", "E"});

    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "namespace A {\n"
            "namespace B {\n"
            "namespace E {\n"
            "\n"
            "}  // namespace E\n"
            "}  // namespace B\n"
            "}  // namespace A\n");
}